

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O0

void __thiscall
ncnn::Convolution3D::make_padding
          (Convolution3D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int *piVar1;
  void *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Option opt_b_2;
  int dpad_1;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int dpad;
  int hpad;
  int wpad;
  Option opt_b;
  int kernel_extent_d;
  int kernel_extent_h;
  int kernel_extent_w;
  int d;
  int h;
  int w;
  float in_stack_fffffffffffffe84;
  float v;
  int in_stack_fffffffffffffe88;
  int right;
  int in_stack_fffffffffffffe8c;
  int left;
  Mat *in_stack_fffffffffffffe90;
  Mat *pMVar2;
  undefined1 local_158 [8];
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  Option *in_stack_fffffffffffffec8;
  undefined1 local_108 [8];
  undefined8 local_100;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  int local_78;
  int local_74;
  float local_70;
  int local_6c;
  int local_68;
  int local_64;
  void *local_60;
  int local_40;
  undefined4 local_3c;
  Mat *local_38;
  Mat *local_28;
  int local_20;
  undefined4 local_1c;
  void *local_10;
  
  local_64 = in_RSI->w;
  local_68 = in_RSI->h;
  local_6c = in_RSI->d;
  local_70 = (float)(*(int *)&in_RDI[3].refcount * (*(int *)((long)&in_RDI[2].cstep + 4) + -1) + 1);
  local_74 = *(int *)((long)&in_RDI[3].refcount + 4) * (*(int *)&in_RDI[3].data + -1) + 1;
  local_78 = (int)in_RDI[3].elemsize * (*(int *)((long)&in_RDI[3].data + 4) + -1) + 1;
  local_60 = in_RCX;
  local_28 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI->refcount != (int *)0x0) {
      piVar1 = in_RSI->refcount;
      local_3c = 1;
      LOCK();
      local_40 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    pMVar2 = in_RDX;
    local_38 = in_RSI;
    if (in_RDX->refcount != (int *)0x0) {
      piVar1 = in_RDX->refcount;
      local_1c = 0xffffffff;
      LOCK();
      local_20 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_20 == 1) {
        if (in_RDX->allocator == (Allocator *)0x0) {
          local_10 = in_RDX->data;
          if (local_10 != (void *)0x0) {
            free(local_10);
          }
        }
        else {
          (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
        }
      }
    }
    in_RDX->data = (void *)0x0;
    in_RDX->elemsize = 0;
    in_RDX->elempack = 0;
    in_RDX->dims = 0;
    in_RDX->w = 0;
    in_RDX->h = 0;
    in_RDX->d = 0;
    in_RDX->c = 0;
    in_RDX->cstep = 0;
    in_RDX->refcount = (int *)0x0;
    pMVar2->data = local_38->data;
    pMVar2->refcount = local_38->refcount;
    pMVar2->elemsize = local_38->elemsize;
    pMVar2->elempack = local_38->elempack;
    pMVar2->allocator = local_38->allocator;
    pMVar2->dims = local_38->dims;
    pMVar2->w = local_38->w;
    pMVar2->h = local_38->h;
    pMVar2->d = local_38->d;
    pMVar2->c = local_38->c;
    pMVar2->cstep = local_38->cstep;
    in_stack_fffffffffffffe90 = in_RDX;
    local_28 = pMVar2;
  }
  if ((((*(int *)&in_RDI[3].allocator < 1) && (*(int *)((long)&in_RDI[3].allocator + 4) < 1)) &&
      (in_RDI[3].dims < 1)) && (((in_RDI[3].w < 1 && (in_RDI[3].h < 1)) && (in_RDI[3].d < 1)))) {
    if (((*(int *)&in_RDI[3].allocator == -0xe9) &&
        (*(int *)((long)&in_RDI[3].allocator + 4) == -0xe9)) &&
       ((in_RDI[3].dims == -0xe9 &&
        (((in_RDI[3].w == -0xe9 && (in_RDI[3].h == -0xe9)) && (in_RDI[3].d == -0xe9)))))) {
      local_bc = ((int)local_70 +
                 ((local_64 + -1) / *(int *)((long)&in_RDI[3].elemsize + 4)) *
                 *(int *)((long)&in_RDI[3].elemsize + 4)) - local_64;
      local_c0 = (local_74 + ((local_68 + -1) / in_RDI[3].elempack) * in_RDI[3].elempack) - local_68
      ;
      local_c4 = (local_78 +
                 ((local_6c + -1) / *(int *)&in_RDI[3].field_0x1c) * *(int *)&in_RDI[3].field_0x1c)
                 - local_6c;
      if (((0 < local_bc) || (0 < local_c0)) || (0 < local_c4)) {
        v = local_70;
        right = local_74;
        left = local_78;
        memcpy(local_108,local_60,0x40);
        local_100 = *(undefined8 *)((long)local_60 + 0x10);
        copy_make_border_3d(local_28,in_RDI,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            (int)in_stack_fffffffffffffe90,left,right,in_stack_fffffffffffffeb0,
                            in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,v,
                            in_stack_fffffffffffffec8);
      }
    }
    else if (((*(int *)&in_RDI[3].allocator == -0xea) &&
             (*(int *)((long)&in_RDI[3].allocator + 4) == -0xea)) &&
            ((in_RDI[3].dims == -0xea &&
             (((in_RDI[3].w == -0xea && (in_RDI[3].h == -0xea)) && (in_RDI[3].d == -0xea)))))) {
      if (((0 < ((int)local_70 +
                ((local_64 + -1) / *(int *)((long)&in_RDI[3].elemsize + 4)) *
                *(int *)((long)&in_RDI[3].elemsize + 4)) - local_64) ||
          (0 < (local_74 + ((local_68 + -1) / in_RDI[3].elempack) * in_RDI[3].elempack) - local_68))
         || (0 < (local_78 +
                 ((local_6c + -1) / *(int *)&in_RDI[3].field_0x1c) * *(int *)&in_RDI[3].field_0x1c)
                 - local_6c)) {
        memcpy(local_158,local_60,0x40);
        copy_make_border_3d(local_28,in_RDI,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                            in_stack_fffffffffffffe88,(int)*(undefined8 *)((long)local_60 + 0x10),
                            in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffe84,in_stack_fffffffffffffec8);
      }
    }
  }
  else {
    memcpy(local_b8,local_60,0x40);
    local_b0 = *(undefined8 *)((long)local_60 + 0x10);
    copy_make_border_3d(local_28,in_RDI,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                        (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                        in_stack_fffffffffffffe88,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                        in_stack_fffffffffffffe84,in_stack_fffffffffffffec8);
  }
  return;
}

Assistant:

void Convolution3D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, pad_front, pad_behind, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233 && pad_front == -233 && pad_behind == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_extent_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234 && pad_front == -234 && pad_behind == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_extent_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}